

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void cleanupvarinfo(rnnvarinfo *vi)

{
  int local_14;
  int i;
  rnnvarinfo *vi_local;
  
  free(vi->prefix);
  free(vi->prefixstr);
  free(vi->varsetstr);
  free(vi->variantsstr);
  for (local_14 = 0; local_14 < vi->varsetsnum; local_14 = local_14 + 1) {
    freevarset(vi->varsets[local_14]);
  }
  free(vi->varsets);
  return;
}

Assistant:

static void cleanupvarinfo(struct rnnvarinfo *vi) {
	free(vi->prefix);
	free(vi->prefixstr);
	free(vi->varsetstr);
	free(vi->variantsstr);

	int i;
	for (i = 0; i < vi->varsetsnum; i++)
		freevarset(vi->varsets[i]);
	free(vi->varsets);
}